

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

string * __thiscall
tinyformat::
format<std::__cxx11::string,std::__cxx11::string,int,std::atomic<int>,long,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,int *args_2,
          atomic<int> *args_3,long *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [112];
  ios_base local_140 [264];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<std::__cxx11::string,std::__cxx11::string,int,std::atomic<int>,long,std::__cxx11::string,std::__cxx11::string>
            ((ostream *)local_1b0,(char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt,args,
             (int *)args_1,(atomic<int> *)args_2,(long *)args_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_4,args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}